

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextNextGenBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::EndFrame
          (DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  SoftwareQueueIndex CmdQueueIndex;
  RenderDeviceVkImpl *this_00;
  DeviceContextNextGenBase<Diligent::EngineVkImplTraits> *this_local;
  memory_order __b;
  
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                    (&this->super_DeviceContextBase<Diligent::EngineVkImplTraits>);
  if (bVar1) {
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    (this->m_SubmittedBuffersCmdQueueMask).super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
  }
  else {
    this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                        (&(this->super_DeviceContextBase<Diligent::EngineVkImplTraits>).m_pDevice);
    CmdQueueIndex = GetCommandQueueId(this);
    RenderDeviceVkImpl::FlushStaleResources(this_00,CmdQueueIndex);
  }
  DeviceContextBase<Diligent::EngineVkImplTraits>::EndFrame
            (&this->super_DeviceContextBase<Diligent::EngineVkImplTraits>);
  return;
}

Assistant:

void EndFrame()
    {
        if (this->IsDeferred())
        {
            // For deferred context, reset submitted cmd queue mask
            m_SubmittedBuffersCmdQueueMask.store(0);
        }
        else
        {
            this->m_pDevice->FlushStaleResources(this->GetCommandQueueId());
        }
        TBase::EndFrame();
    }